

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

int sftp_reqfind(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*bv <= *av) {
    uVar1 = (uint)(*bv < *av);
  }
  return uVar1;
}

Assistant:

static int sftp_reqfind(void *av, void *bv)
{
    unsigned *a = (unsigned *) av;
    struct sftp_request *b = (struct sftp_request *)bv;
    if (*a < b->id)
        return -1;
    if (*a > b->id)
        return +1;
    return 0;
}